

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O3

bool __thiscall
PartiallySignedTransaction::GetInputUTXO
          (PartiallySignedTransaction *this,CTxOut *utxo,int input_index)

{
  CAmount *pCVar1;
  long lVar2;
  pointer pPVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = (long)input_index;
  pPVar3 = (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)pPVar3[lVar7].non_witness_utxo.
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (lVar4 == 0) {
    lVar4 = pPVar3[lVar7].witness_utxo.nValue;
    if (lVar4 == -1) goto LAB_00d800f5;
    utxo->nValue = lVar4;
    other = &pPVar3[lVar7].witness_utxo.scriptPubKey.super_CScriptBase;
  }
  else {
    pcVar8 = (char *)(lVar7 * 0x68 +
                     *(long *)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                               _M_payload.
                               super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                               super__Optional_payload_base<CMutableTransaction>._M_payload._M_value
                               .vin);
    uVar6 = (ulong)*(uint *)(pcVar8 + 0x20);
    uVar9 = (*(long *)(lVar4 + 0x20) - *(long *)(lVar4 + 0x18) >> 3) * -0x3333333333333333;
    if ((uVar9 < uVar6 || uVar9 - uVar6 == 0) ||
       (auVar11[0] = -(*pcVar8 == *(char *)(lVar4 + 0x39)),
       auVar11[1] = -(pcVar8[1] == *(char *)(lVar4 + 0x3a)),
       auVar11[2] = -(pcVar8[2] == *(char *)(lVar4 + 0x3b)),
       auVar11[3] = -(pcVar8[3] == *(char *)(lVar4 + 0x3c)),
       auVar11[4] = -(pcVar8[4] == *(char *)(lVar4 + 0x3d)),
       auVar11[5] = -(pcVar8[5] == *(char *)(lVar4 + 0x3e)),
       auVar11[6] = -(pcVar8[6] == *(char *)(lVar4 + 0x3f)),
       auVar11[7] = -(pcVar8[7] == *(char *)(lVar4 + 0x40)),
       auVar11[8] = -(pcVar8[8] == *(char *)(lVar4 + 0x41)),
       auVar11[9] = -(pcVar8[9] == *(char *)(lVar4 + 0x42)),
       auVar11[10] = -(pcVar8[10] == *(char *)(lVar4 + 0x43)),
       auVar11[0xb] = -(pcVar8[0xb] == *(char *)(lVar4 + 0x44)),
       auVar11[0xc] = -(pcVar8[0xc] == *(char *)(lVar4 + 0x45)),
       auVar11[0xd] = -(pcVar8[0xd] == *(char *)(lVar4 + 0x46)),
       auVar11[0xe] = -(pcVar8[0xe] == *(char *)(lVar4 + 0x47)),
       auVar11[0xf] = -(pcVar8[0xf] == *(char *)(lVar4 + 0x48)),
       auVar10[0] = -(pcVar8[0x10] == *(char *)(lVar4 + 0x49)),
       auVar10[1] = -(pcVar8[0x11] == *(char *)(lVar4 + 0x4a)),
       auVar10[2] = -(pcVar8[0x12] == *(char *)(lVar4 + 0x4b)),
       auVar10[3] = -(pcVar8[0x13] == *(char *)(lVar4 + 0x4c)),
       auVar10[4] = -(pcVar8[0x14] == *(char *)(lVar4 + 0x4d)),
       auVar10[5] = -(pcVar8[0x15] == *(char *)(lVar4 + 0x4e)),
       auVar10[6] = -(pcVar8[0x16] == *(char *)(lVar4 + 0x4f)),
       auVar10[7] = -(pcVar8[0x17] == *(char *)(lVar4 + 0x50)),
       auVar10[8] = -(pcVar8[0x18] == *(char *)(lVar4 + 0x51)),
       auVar10[9] = -(pcVar8[0x19] == *(char *)(lVar4 + 0x52)),
       auVar10[10] = -(pcVar8[0x1a] == *(char *)(lVar4 + 0x53)),
       auVar10[0xb] = -(pcVar8[0x1b] == *(char *)(lVar4 + 0x54)),
       auVar10[0xc] = -(pcVar8[0x1c] == *(char *)(lVar4 + 0x55)),
       auVar10[0xd] = -(pcVar8[0x1d] == *(char *)(lVar4 + 0x56)),
       auVar10[0xe] = -(pcVar8[0x1e] == *(char *)(lVar4 + 0x57)),
       auVar10[0xf] = -(pcVar8[0x1f] == *(char *)(lVar4 + 0x58)), auVar10 = auVar10 & auVar11,
       (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff)) {
LAB_00d800f5:
      bVar5 = false;
      goto LAB_00d800f7;
    }
    pCVar1 = (CAmount *)(*(long *)(lVar4 + 0x18) + uVar6 * 0x28);
    other = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(pCVar1 + 1);
    utxo->nValue = *pCVar1;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(utxo->scriptPubKey).super_CScriptBase,other);
  bVar5 = true;
LAB_00d800f7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool PartiallySignedTransaction::GetInputUTXO(CTxOut& utxo, int input_index) const
{
    const PSBTInput& input = inputs[input_index];
    uint32_t prevout_index = tx->vin[input_index].prevout.n;
    if (input.non_witness_utxo) {
        if (prevout_index >= input.non_witness_utxo->vout.size()) {
            return false;
        }
        if (input.non_witness_utxo->GetHash() != tx->vin[input_index].prevout.hash) {
            return false;
        }
        utxo = input.non_witness_utxo->vout[prevout_index];
    } else if (!input.witness_utxo.IsNull()) {
        utxo = input.witness_utxo;
    } else {
        return false;
    }
    return true;
}